

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_tiled_argb(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QThreadPool *pQVar4;
  ulong uVar5;
  int cStart;
  QT_FT_Span *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  int const_alpha;
  CompositionFunction func;
  int yoff;
  int xoff;
  int image_height;
  int image_width;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_48_8_3fbc74da function;
  Operator op;
  int iVar6;
  int iVar7;
  QThreadPool *this;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined1 *local_f0;
  undefined1 local_e8 [8];
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  undefined1 local_b8 [176];
  long local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX[0xd].x == 6) || (in_RDX[0xd].x == 4)) {
    memcpy(local_b8,&DAT_00bfda70,0xb0);
    getOperator((QSpanData *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QT_FT_Span *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),iVar7);
    iVar7 = in_RDX[0xb].x;
    iVar6 = in_RDX[0xb].len;
    iVar2 = qRound(5.84478078020128e-317);
    cStart = -iVar2 % iVar7;
    iVar2 = qRound(5.84480696568051e-317);
    iVar2 = -iVar2 % iVar6;
    if (cStart < 0) {
      cStart = iVar7 + cStart;
    }
    if (iVar2 < 0) {
      iVar2 = iVar6 + iVar2;
    }
    iVar1 = in_RDX[0xe].y;
    memset(local_e8,0xaa,0x30);
    iVar3 = (in_EDI + 0x20) / 0x40;
    local_e0 = cStart;
    local_dc = iVar7;
    local_d8 = iVar2;
    local_d4 = iVar6;
    local_d0 = iVar1;
    pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((1 < iVar3) && (2 < (int)qPixelLayouts[*(uint *)(*(long *)in_RDX + 0x10)].bpp)) &&
       (pQVar4 != (QThreadPool *)0x0)) {
      this = pQVar4;
      QThread::currentThread();
      uVar5 = QThreadPool::contains((QThread *)pQVar4);
      if ((uVar5 & 1) == 0) {
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_f0,0);
        iVar7 = 0;
        for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
          iVar2 = (in_EDI - iVar7) / (iVar3 - iVar6);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4952:5),_true>
                    (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar7,iVar6),iVar2);
          iVar7 = iVar2 + iVar7;
        }
        QSemaphore::acquire((int)&local_f0);
        QSemaphore::~QSemaphore((QSemaphore *)&local_f0);
        goto LAB_00b48510;
      }
    }
    blend_tiled_argb::anon_class_48_8_3fbc74da::operator()
              ((anon_class_48_8_3fbc74da *)CONCAT44(iVar7,iVar6),cStart,iVar2);
  }
  else {
    blend_tiled_generic((int)((ulong)in_RSI >> 0x20),in_RDX,in_RDX);
  }
LAB_00b48510:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_tiled_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;
    const auto func = op.func;
    const int const_alpha = data->texture.const_alpha;

    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                func(dest, src, l, coverage);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}